

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_file.cpp
# Opt level: O3

void libtorrent::aux::copy_file(string *inf,string *newf,storage_error *se)

{
  int iVar1;
  int *piVar2;
  __off64_t __offset;
  __off64_t __offset_00;
  ssize_t sVar3;
  copy_range_mode m;
  file_descriptor infd;
  file_descriptor outfd;
  native_path_string f2;
  native_path_string f1;
  stat in_stat;
  copy_range_mode local_109;
  file_descriptor local_108;
  file_descriptor local_104;
  native_path_string local_100;
  native_path_string local_e0;
  stat64 local_c0;
  
  (se->ec).val_ = 0;
  (se->ec).failed_ = false;
  (se->ec).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  convert_to_native_path_string(&local_e0,inf);
  convert_to_native_path_string(&local_100,newf);
  local_108.m_fd = open64(local_e0._M_dataplus._M_p,0);
  if ((local_108.m_fd < 0) || (iVar1 = fstat64(local_108.m_fd,&local_c0), iVar1 != 0)) {
    se->operation = file_stat;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    (se->ec).val_ = iVar1;
    (se->ec).failed_ = iVar1 != 0;
    (se->ec).cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    goto LAB_00196733;
  }
  local_104.m_fd =
       open64(local_100._M_dataplus._M_p,
              (uint)(local_c0.st_blocks * 0x200 < local_c0.st_size) << 9 | 0x42,
              (ulong)local_c0.st_mode);
  if (local_104.m_fd < 0) {
    se->operation = file_open;
LAB_001966dc:
    piVar2 = __errno_location();
    iVar1 = *piVar2;
LAB_001966e3:
    (se->ec).val_ = iVar1;
    (se->ec).failed_ = iVar1 != 0;
    (se->ec).cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  }
  else {
    iVar1 = ftruncate64(local_104.m_fd,local_c0.st_size);
    if (iVar1 < 0) {
      se->operation = file_truncate;
      goto LAB_001966dc;
    }
    if (local_c0.st_blocks * 0x200 < local_c0.st_size) {
      local_109.use_fallback = false;
      __offset_00 = 0;
      while (__offset = lseek64(local_108.m_fd,__offset_00,3), __offset != -1) {
        __offset_00 = lseek64(local_108.m_fd,__offset,4);
        if (__offset_00 == -1) {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          goto LAB_00196706;
        }
        sVar3 = anon_unknown_1::copy_range
                          (local_108.m_fd,local_104.m_fd,__offset,__offset_00 - __offset,&local_109,
                           se);
        if ((__offset_00 == local_c0.st_size) || (sVar3 < 1)) goto LAB_00196729;
      }
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 != 6) {
LAB_00196706:
        if (iVar1 == 0x5f) goto LAB_0019670b;
        se->operation = file_seek;
        goto LAB_001966e3;
      }
    }
    else {
LAB_0019670b:
      local_109.use_fallback = false;
      anon_unknown_1::copy_range(local_108.m_fd,local_104.m_fd,0,local_c0.st_size,&local_109,se);
    }
  }
LAB_00196729:
  file_descriptor::~file_descriptor(&local_104);
LAB_00196733:
  file_descriptor::~file_descriptor(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void copy_file(std::string const& inf, std::string const& newf, storage_error& se)
{
	se.ec.clear();
	native_path_string f1 = convert_to_native_path_string(inf);
	native_path_string f2 = convert_to_native_path_string(newf);

	aux::file_descriptor const infd = ::open(f1.c_str(), O_RDONLY);
	if (infd.fd() < 0)
	{
		se.operation = operation_t::file_stat;
		se.ec.assign(errno, system_category());
		return;
	}

	struct stat in_stat;
	if (::fstat(infd.fd(), &in_stat) != 0)
	{
		se.operation = operation_t::file_stat;
		se.ec.assign(errno, system_category());
		return;
	}

	bool const input_is_sparse = in_stat.st_size > off_t(in_stat.st_blocks) * 512;

	// if the source file is not sparse we'll end up copying every byte anyway,
	// there's no point in passing O_TRUNC. However, in order to preserve sparse
	// regions, we *do* need to truncate the output file.
	aux::file_descriptor const outfd = ::open(f2.c_str()
		, input_is_sparse ? (O_RDWR | O_CREAT | O_TRUNC) : (O_RDWR | O_CREAT), in_stat.st_mode);
	if (outfd.fd() < 0)
	{
		se.operation = operation_t::file_open;
		se.ec.assign(errno, system_category());
		return;
	}

#if TORRENT_HAS_COPYFILE
	if (!input_is_sparse)
	{
		// the the file isn't sparse use the system copy function (which
		// expands sparse regions)
		// this only works on 10.5
		copyfile_state_t state = copyfile_state_alloc();
		if (fcopyfile(infd.fd(), outfd.fd(), state, COPYFILE_ALL) < 0)
		{
			se.operation = operation_t::file_copy;
			se.ec.assign(errno, system_category());
		}
		copyfile_state_free(state);
		return;
	}
#endif

	if (::ftruncate(outfd.fd(), in_stat.st_size) < 0)
	{
		se.operation = operation_t::file_truncate;
		se.ec.assign(errno, system_category());
		return;
	}

#ifdef SEEK_HOLE
	if (input_is_sparse)
	{
		copy_range_mode m;
		ssize_t ret = 0;
		off_t data_start = 0;
		off_t data_end = 0;
		for (;;)
		{
			data_start = ::lseek(infd.fd(), data_end, SEEK_DATA);
			if (data_start == off_t(-1))
			{
				int const err = errno;
				// if we SEEK_DATA while the file location is past the last
				// non-sparse region (i.e. the file has been truncated without
				// filled in, the end of the file may be a sparse region). In
				// this case there's nothing left to copy, and we're done
				if (err == ENXIO) return;
				// if SEEK_DATA is not supported, fall back to plain copy
				if (err == ENOTSUP) break;
				se.operation = operation_t::file_seek;
				se.ec.assign(err, system_category());
				return;
			}

			data_end = ::lseek(infd.fd(), data_start, SEEK_HOLE);
			if (data_end == off_t(-1))
			{
				int const err = errno;
				if (err == ENOTSUP) break;
				se.operation = operation_t::file_seek;
				se.ec.assign(err, system_category());
				return;
			}

			ret = copy_range(infd.fd(), outfd.fd(), data_start, data_end - data_start, &m, se);
			if (ret <= 0) return;
			if (data_end == in_stat.st_size) return;
		}
	}
#endif

	copy_range_mode m;
	copy_range(infd.fd(), outfd.fd(), 0, in_stat.st_size, &m, se);
}